

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::ReadNumericExpr
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *this,int opcode)

{
  Kind KVar1;
  int iVar2;
  OpCodeInfo *pOVar3;
  int iVar4;
  SymbolicArgHandler args_2;
  NumberOfArgHandler args_3;
  NumericArgHandler args;
  VarArgHandler args_1;
  BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::NumericExprReader>
  args_4;
  
  pOVar3 = GetOpCodeInfo(opcode);
  KVar1 = pOVar3->first_kind;
  switch(KVar1) {
  case IF:
    ReadLogicalExpr(this);
    ReadNumericExpr(this,false);
    goto LAB_00184505;
  case PLTERM:
    iVar2 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
    if (iVar2 < 2) {
      TextReader<fmt::Locale>::ReportError<>(this->reader_,(CStringRef)0x211bfa);
    }
    TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
    iVar4 = 1;
    if (1 < iVar2) {
      iVar4 = iVar2;
    }
    while( true ) {
      ReadConstant(this);
      if (iVar4 + -1 == 0) break;
      ReadConstant(this);
      iVar4 = iVar4 + -1;
    }
    ReadReference(this);
    return;
  case CALL:
  case LAST_VARARG:
switchD_001844e1_caseD_29:
    TextReader<fmt::Locale>::ReportError<>(this->reader_,(CStringRef)0x214f2a);
    return;
  case FIRST_ITERATED:
    iVar2 = ReadNumArgs(this,1);
    NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
    ReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::NumericExprReader,TestNLHandler2::VarArgHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2> *)this,iVar2,&args_1)
    ;
    break;
  case SUM:
    iVar2 = ReadNumArgs(this,3);
    NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
    ReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::NumericExprReader,TestNLHandler2::NumericArgHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2> *)this,iVar2,&args);
    break;
  case LAST_ITERATED:
    iVar2 = ReadNumArgs(this,1);
    TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
    ReadNumericExpr(this,false);
    NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
    DoReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::NumericExprReader,TestNLHandler2::NumberOfArgHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2> *)this,iVar2 + -1,
               &args_3);
    break;
  case NUMBEROF_SYM:
    iVar2 = ReadNumArgs(this,1);
    TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
    ReadSymbolicExpr(this);
    NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
    DoReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::SymbolicExprReader,TestNLHandler2::SymbolicArgHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2> *)this,iVar2 + -1,
               &args_2);
    break;
  case COUNT:
    ReadCountExpr(this);
    return;
  default:
    if (KVar1 == ADD) {
      BinaryArgReader<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::NumericExprReader>
      ::BinaryArgReader(&args_4,this);
      return;
    }
    if (KVar1 != FIRST_UNARY) goto switchD_001844e1_caseD_29;
LAB_00184505:
    ReadNumericExpr(this,false);
    return;
  }
  return;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}